

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertStrUtil.cpp
# Opt level: O2

wstring * lzstring::to_wstring(wstring *__return_storage_ptr__,string *src)

{
  size_t sVar1;
  vector<wchar_t,_std::allocator<wchar_t>_> tmp;
  allocator_type local_29;
  _Vector_base<wchar_t,_std::allocator<wchar_t>_> local_28;
  
  setlocale(0,"zh_CN");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  sVar1 = mbstowcs((wchar_t *)0x0,(src->_M_dataplus)._M_p,0);
  std::vector<wchar_t,_std::allocator<wchar_t>_>::vector
            ((vector<wchar_t,_std::allocator<wchar_t>_> *)&local_28,sVar1 + 1,&local_29);
  mbstowcs(local_28._M_impl.super__Vector_impl_data._M_start,(src->_M_dataplus)._M_p,
           src->_M_string_length);
  std::__cxx11::wstring::
  assign<__gnu_cxx::__normal_iterator<wchar_t*,std::vector<wchar_t,std::allocator<wchar_t>>>,void>
            ((wstring *)__return_storage_ptr__,
             (__normal_iterator<wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>)
             local_28._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>)
             (local_28._M_impl.super__Vector_impl_data._M_finish + -1));
  std::_Vector_base<wchar_t,_std::allocator<wchar_t>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::wstring to_wstring(std::string const &src)
{
    //   std::setlocale(LC_CTYPE, "");
    std::setlocale(LC_CTYPE, "zh_CN");

    std::wstring dest;
    size_t const wcs_len = mbstowcs(NULL, src.c_str(), 0);
    std::vector<wchar_t> tmp(wcs_len + 1);
    mbstowcs(&tmp[0], src.c_str(), src.size());

    dest.assign(tmp.begin(), tmp.end() - 1);

    return dest;
}